

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O3

uint32_t get_literal_price(lzma_lzma1_encoder *coder,uint32_t pos,uint32_t prev_byte,
                          _Bool match_mode,uint32_t match_byte,uint32_t symbol)

{
  byte bVar1;
  uint32_t uVar2;
  undefined7 in_register_00000009;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  bVar1 = (byte)coder->literal_context_bits;
  uVar3 = (prev_byte >> (8 - bVar1 & 0x1f)) + ((pos & coder->literal_pos_mask) << (bVar1 & 0x1f));
  uVar5 = symbol + 0x100;
  if ((int)CONCAT71(in_register_00000009,match_mode) == 0) {
    uVar2 = 0;
    do {
      uVar4 = uVar5 >> 1;
      uVar2 = uVar2 + lzma_rc_prices
                      [(-(uVar5 & 1) & 0x7f0 ^
                       (uint)*(ushort *)((long)coder->literal[uVar3] + (ulong)(uVar5 & 0xfffffffe)))
                       >> 4];
      uVar5 = uVar4;
    } while (uVar4 != 1);
  }
  else {
    uVar2 = 0;
    uVar4 = 0x100;
    do {
      match_byte = match_byte * 2;
      uVar2 = uVar2 + lzma_rc_prices
                      [((uint)(int)(char)uVar5 >> 7 & 0x7f0 ^
                       (uint)coder->literal[uVar3][(uVar5 >> 8) + uVar4 + (match_byte & uVar4)]) >>
                       4];
      uVar5 = uVar5 * 2;
      uVar4 = uVar4 & ~(uVar5 ^ match_byte);
    } while (uVar5 < 0x10000);
  }
  return uVar2;
}

Assistant:

static uint32_t
get_literal_price(const lzma_lzma1_encoder *const coder, const uint32_t pos,
		const uint32_t prev_byte, const bool match_mode,
		uint32_t match_byte, uint32_t symbol)
{
	const probability *const subcoder = literal_subcoder(coder->literal,
			coder->literal_context_bits, coder->literal_pos_mask,
			pos, prev_byte);

	uint32_t price = 0;

	if (!match_mode) {
		price = rc_bittree_price(subcoder, 8, symbol);
	} else {
		uint32_t offset = 0x100;
		symbol += UINT32_C(1) << 8;

		do {
			match_byte <<= 1;

			const uint32_t match_bit = match_byte & offset;
			const uint32_t subcoder_index
					= offset + match_bit + (symbol >> 8);
			const uint32_t bit = (symbol >> 7) & 1;
			price += rc_bit_price(subcoder[subcoder_index], bit);

			symbol <<= 1;
			offset &= ~(match_byte ^ symbol);

		} while (symbol < (UINT32_C(1) << 16));
	}

	return price;
}